

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::PerfectAggregateHashTable::Destroy(PerfectAggregateHashTable *this)

{
  data_ptr_t pdVar1;
  bool bVar2;
  TupleDataLayout *pTVar3;
  type pTVar4;
  AggregateObject *aggr;
  pointer pAVar5;
  idx_t i;
  ulong uVar6;
  idx_t count;
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  data_ptr_t pdVar7;
  RowOperationsState row_state;
  RowOperationsState local_40;
  
  this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
  pTVar3 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
  bVar2 = false;
  for (pAVar5 = (pTVar3->aggregates).
                super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
                super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar5 != (pTVar3->aggregates).
                super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
                super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                ._M_impl.super__Vector_impl_data._M_finish; pAVar5 = pAVar5 + 1) {
    bVar2 = (bool)(bVar2 | (pAVar5->function).destructor != (aggregate_destructor_t)0x0);
  }
  if (bVar2) {
    pdVar1 = (this->addresses).data;
    local_40.allocator =
         unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
         operator*(&this->aggregate_allocator);
    local_40.addresses.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)
         (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0;
    pdVar7 = this->data;
    count = 0;
    for (uVar6 = 0; uVar6 < this->total_groups; uVar6 = uVar6 + 1) {
      *(data_ptr_t *)(pdVar1 + count * 8) = pdVar7;
      count = count + 1;
      if (count == 0x800) {
        pTVar4 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
        RowOperations::DestroyStates(&local_40,pTVar4,&this->addresses,0x800);
        count = 0;
      }
      pdVar7 = pdVar7 + this->tuple_size;
    }
    pTVar4 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
    RowOperations::DestroyStates(&local_40,pTVar4,&this->addresses,count);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              (&local_40.addresses.
                super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>);
  }
  return;
}

Assistant:

void PerfectAggregateHashTable::Destroy() {
	// check if there is any destructor to call
	bool has_destructor = false;
	for (auto &aggr : layout_ptr->GetAggregates()) {
		if (aggr.function.destructor) {
			has_destructor = true;
		}
	}
	if (!has_destructor) {
		return;
	}
	// there are aggregates with destructors: loop over the hash table
	// and call the destructor method for each of the aggregates
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	idx_t count = 0;

	// iterate over all initialised slots of the hash table
	RowOperationsState row_state(*aggregate_allocator);
	data_ptr_t payload_ptr = data;
	for (idx_t i = 0; i < total_groups; i++) {
		data_pointers[count++] = payload_ptr;
		if (count == STANDARD_VECTOR_SIZE) {
			RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
			count = 0;
		}
		payload_ptr += tuple_size;
	}
	RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
}